

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

url_mapper * __thiscall
cppcms::url_mapper::get_mapper_for_key
          (url_mapper *this,string_key *key,string_key *real_key,
          vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *keywords)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t in_RCX;
  string_key *in_RDI;
  string_key subapp;
  size_t chunk_size;
  url_mapper *tmp;
  size_t size;
  size_t separator;
  size_t end;
  size_t pos;
  url_mapper *mapper;
  string_key *in_stack_fffffffffffffe88;
  string_key *in_stack_fffffffffffffe90;
  url_mapper *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  string_key *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *in_stack_fffffffffffffec0;
  string_key *in_stack_fffffffffffffec8;
  url_mapper *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  string_key *in_stack_fffffffffffffee0;
  string_key local_e0;
  long local_b0;
  string_key *in_stack_ffffffffffffff70;
  string_key *in_stack_ffffffffffffff78;
  data *in_stack_ffffffffffffff80;
  long local_38;
  string_key *local_30;
  string_key *local_8;
  
  bVar1 = string_key::empty(in_stack_fffffffffffffe90);
  if (bVar1) {
    string_key::clear((string_key *)0x3bbce3);
    local_8 = in_RDI;
  }
  else {
    pcVar2 = string_key::operator[](in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    local_30 = in_RDI;
    if (*pcVar2 == '/') {
      local_30 = (string_key *)topmost(in_stack_fffffffffffffe98);
    }
    while (sVar3 = string_key::find((string_key *)
                                    CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                                    (char)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
                                    CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)),
          sVar3 != 0xffffffffffffffff) {
      in_stack_fffffffffffffeb0 = (string_key *)&stack0xfffffffffffffed0;
      string_key::unowned_substr
                (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
                 CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      in_stack_fffffffffffffebf =
           cppcms::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (!(bool)in_stack_fffffffffffffebf) {
        in_stack_fffffffffffffeaf =
             cppcms::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if ((bool)in_stack_fffffffffffffeaf) {
          local_30 = (string_key *)parent(in_stack_fffffffffffffed0);
        }
        else {
          booster::hold_ptr<cppcms::url_mapper::data>::operator->
                    ((hold_ptr<cppcms::url_mapper::data> *)local_30);
          in_stack_fffffffffffffe90 =
               (string_key *)
               data::child(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
          local_30 = in_stack_fffffffffffffe90;
        }
      }
      string_key::~string_key((string_key *)0x3bc128);
    }
    sVar3 = string_key::find((string_key *)
                             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                             (char)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
                             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    if (sVar3 == 0xffffffffffffffff) {
      string_key::unowned_substr
                (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
                 CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      string_key::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      string_key::~string_key((string_key *)0x3bbdd8);
    }
    else {
      std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::reserve
                (in_stack_fffffffffffffec0,
                 CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      string_key::unowned_substr
                (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
                 CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      string_key::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      string_key::~string_key((string_key *)0x3bbe3e);
      do {
        local_38 = sVar3 + 1;
        sVar3 = string_key::find((string_key *)
                                 CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                                 (char)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
                                 CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
        local_b0 = sVar3 - local_38;
        string_key::unowned_substr
                  (&local_e0,in_RCX,CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::push_back
                  ((vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *)
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        string_key::~string_key((string_key *)0x3bbee4);
      } while (sVar3 != 0xffffffffffffffff);
    }
    bVar1 = cppcms::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (bVar1) {
      string_key::clear((string_key *)0x3bbf59);
    }
    else {
      bVar1 = cppcms::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (bVar1) {
        local_30 = (string_key *)parent(in_stack_fffffffffffffed0);
        string_key::clear((string_key *)0x3bbf97);
      }
    }
    booster::hold_ptr<cppcms::url_mapper::data>::operator->
              ((hold_ptr<cppcms::url_mapper::data> *)local_30);
    local_8 = (string_key *)
              data::is_app((data *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb0);
    if (local_8 == (string_key *)0x0) {
      local_8 = local_30;
    }
    else {
      string_key::clear((string_key *)0x3bbfd6);
    }
  }
  return (url_mapper *)local_8;
}

Assistant:

url_mapper &url_mapper::get_mapper_for_key(string_key const &key,string_key &real_key,std::vector<string_key> &keywords)
	{
		url_mapper *mapper = this;
		size_t pos = 0;
		if(key.empty()) {
			real_key.clear();
			return *mapper;
		}
		if(key[0]=='/') {
			mapper = &mapper->topmost();
			pos = 1;
		}
		for(;;) {
			size_t end = key.find('/',pos);
			if(end == std::string::npos) {
				size_t separator = key.find(';',pos);
				if(separator == std::string::npos) {
					real_key = key.unowned_substr(pos);
				}
				else {
					keywords.reserve(6);
					real_key = key.unowned_substr(pos,separator - pos);
					pos = separator + 1;
					for(;;){
						end = key.find(',',pos);
						size_t size = end - pos;
						keywords.push_back(key.unowned_substr(pos,size));
						if(end == std::string::npos)
							break;
						pos = end + 1;
					}
					
				}
				if(real_key == ".")
					real_key.clear();
				else if(real_key == "..") {
					mapper = &mapper->parent();
					real_key.clear();
				}
					
				url_mapper *tmp = mapper->d->is_app(real_key);
				if(tmp) { 
					// empty special key
					real_key.clear();
					return *tmp;
				}
				return *mapper;
			}
			size_t chunk_size = end - pos;
			string_key subapp = key.unowned_substr(pos,chunk_size);
			if(subapp == ".")
				; // Just continue where we are
			else if(subapp == "..") {
				mapper = &mapper->parent();
			}
			else {
				mapper = &mapper->d->child(subapp,key);
			}
			pos = end + 1;
		}
	}